

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  RtreeNode *pNode_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iCell;
  RtreeCell cell;
  int local_64;
  RtreeCell local_60;
  
  uVar4 = 0;
  do {
    pNode_00 = pNode->pParent;
    if (pNode_00 == (RtreeNode *)0x0) {
      return 0;
    }
    if (uVar4 < 1000) {
      if (pNode->pParent == (RtreeNode *)0x0) {
        local_64 = -1;
      }
      else {
        iVar2 = nodeRowidIndex(pRtree,pNode->pParent,pNode->iNode,&local_64);
        if (iVar2 != 0) goto LAB_001cdbb9;
      }
      iVar2 = local_64;
      nodeGetCell(pRtree,pNode_00,local_64,&local_60);
      bVar1 = true;
      pNode = pNode_00;
      if ((ulong)pRtree->nDim2 != 0) {
        uVar3 = 0;
        do {
          if (pRtree->eCoordType == '\x01') {
            if ((pCell->aCoord[uVar3].i < local_60.aCoord[uVar3].i) ||
               (local_60.aCoord[uVar3 + 1].i < pCell->aCoord[uVar3 + 1].i)) goto LAB_001cdc47;
          }
          else if ((pCell->aCoord[uVar3].f <= local_60.aCoord[uVar3].f &&
                    local_60.aCoord[uVar3].f != pCell->aCoord[uVar3].f) ||
                  (local_60.aCoord[uVar3 + 1].f <= pCell->aCoord[uVar3 + 1].f &&
                   pCell->aCoord[uVar3 + 1].f != local_60.aCoord[uVar3 + 1].f)) {
LAB_001cdc47:
            cellUnion(pRtree,&local_60,pCell);
            nodeOverwriteCell(pRtree,pNode_00,&local_60,iVar2);
            break;
          }
          uVar3 = uVar3 + 2;
        } while (uVar3 < pRtree->nDim2);
      }
    }
    else {
LAB_001cdbb9:
      bVar1 = false;
    }
    uVar4 = uVar4 + 1;
    if (!bVar1) {
      return 0x10b;
    }
  } while( true );
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  int cnt = 0;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    if( (++cnt)>1000 || nodeParentIndex(pRtree, p, &iCell)  ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }
 
    p = pParent;
  }
  return SQLITE_OK;
}